

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.c
# Opt level: O0

_Bool CheckCollisionPointLine(Vector2 point,Vector2 p1,Vector2 p2,int threshold)

{
  byte bVar1;
  byte bVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float cross;
  float dyl;
  float dxl;
  float dyc;
  float dxc;
  float fStack_20;
  _Bool collision;
  int threshold_local;
  Vector2 p2_local;
  Vector2 p1_local;
  Vector2 point_local;
  
  dyc._3_1_ = false;
  p1_local.x = point.x;
  p2_local.x = p1.x;
  p1_local.y = point.y;
  p2_local.y = p1.y;
  fStack_20 = p2.x;
  fVar4 = fStack_20 - p2_local.x;
  threshold_local = (int)p2.y;
  fVar5 = (float)threshold_local - p2_local.y;
  fVar6 = (p1_local.y - p2_local.y) * fVar4;
  fVar3 = -fVar6;
  fVar9 = ABS(fVar4);
  fVar7 = ABS(fVar5);
  fVar8 = fVar7;
  if (fVar7 <= fVar9) {
    fVar8 = fVar9;
  }
  if (ABS((p1_local.x - p2_local.x) * fVar5 + fVar3) <
      (float)threshold * (float)(~-(uint)NAN(fVar9) & (uint)fVar8 | -(uint)NAN(fVar9) & (uint)fVar7)
     ) {
    bVar2 = SUB41(fVar6,0);
    bVar1 = SUB41(fVar3,0);
    if (ABS(fVar4) < ABS(fVar5)) {
      if (fVar5 <= 0.0) {
        bVar2 = bVar2 ^ bVar1;
        if ((float)threshold_local <= p1_local.y) {
          bVar2 = p1_local.y <= p2_local.y;
        }
      }
      else {
        bVar2 = bVar2 ^ bVar1;
        if (p2_local.y <= p1_local.y) {
          bVar2 = p1_local.y <= (float)threshold_local;
        }
      }
    }
    else if (fVar4 <= 0.0) {
      bVar2 = bVar2 ^ bVar1;
      if (fStack_20 <= p1_local.x) {
        bVar2 = p1_local.x <= p2_local.x;
      }
    }
    else {
      bVar2 = bVar2 ^ bVar1;
      if (p2_local.x <= p1_local.x) {
        bVar2 = p1_local.x <= fStack_20;
      }
    }
    dyc._3_1_ = (bVar2 & 1) != 0;
  }
  return dyc._3_1_;
}

Assistant:

bool CheckCollisionPointLine(Vector2 point, Vector2 p1, Vector2 p2, int threshold)
{
    bool collision = false;
    float dxc = point.x - p1.x;
    float dyc = point.y - p1.y;
    float dxl = p2.x - p1.x;
    float dyl = p2.y - p1.y;
    float cross = dxc*dyl - dyc*dxl;

    if (fabsf(cross) < (threshold*fmaxf(fabsf(dxl), fabsf(dyl))))
    {
        if (fabsf(dxl) >= fabsf(dyl)) collision = (dxl > 0)? ((p1.x <= point.x) && (point.x <= p2.x)) : ((p2.x <= point.x) && (point.x <= p1.x));
        else collision = (dyl > 0)? ((p1.y <= point.y) && (point.y <= p2.y)) : ((p2.y <= point.y) && (point.y <= p1.y));
    }
	
    return collision;
}